

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2UnparsedEntityDecl(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  int local_5c;
  int n_notationName;
  xmlChar *notationName;
  int n_systemId;
  xmlChar *systemId;
  int n_publicId;
  xmlChar *publicId;
  int n_name;
  xmlChar *name;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (publicId._4_4_ = 0; (int)publicId._4_4_ < 5; publicId._4_4_ = publicId._4_4_ + 1) {
      for (systemId._4_4_ = 0; (int)systemId._4_4_ < 5; systemId._4_4_ = systemId._4_4_ + 1) {
        for (notationName._4_4_ = 0; (int)notationName._4_4_ < 5;
            notationName._4_4_ = notationName._4_4_ + 1) {
          for (local_5c = 0; local_5c < 5; local_5c = local_5c + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_void_ptr(name._4_4_,0);
            val_00 = gen_const_xmlChar_ptr(publicId._4_4_,1);
            val_01 = gen_const_xmlChar_ptr(systemId._4_4_,2);
            val_02 = gen_const_xmlChar_ptr(notationName._4_4_,3);
            val_03 = gen_const_xmlChar_ptr(local_5c,4);
            xmlSAX2UnparsedEntityDecl(val,val_00,val_01,val_02,val_03);
            call_tests = call_tests + 1;
            des_void_ptr(name._4_4_,val,0);
            des_const_xmlChar_ptr(publicId._4_4_,val_00,1);
            des_const_xmlChar_ptr(systemId._4_4_,val_01,2);
            des_const_xmlChar_ptr(notationName._4_4_,val_02,3);
            des_const_xmlChar_ptr(local_5c,val_03,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAX2UnparsedEntityDecl",
                     (ulong)(uint)(iVar2 - iVar1));
              ctx._4_4_ = ctx._4_4_ + 1;
              printf(" %d",(ulong)name._4_4_);
              printf(" %d",(ulong)publicId._4_4_);
              printf(" %d",(ulong)systemId._4_4_);
              printf(" %d",(ulong)notationName._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2UnparsedEntityDecl(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    xmlChar * name; /* The name of the entity */
    int n_name;
    xmlChar * publicId; /* The public ID of the entity */
    int n_publicId;
    xmlChar * systemId; /* The system ID of the entity */
    int n_systemId;
    xmlChar * notationName; /* the name of the notation */
    int n_notationName;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_publicId = 0;n_publicId < gen_nb_const_xmlChar_ptr;n_publicId++) {
    for (n_systemId = 0;n_systemId < gen_nb_const_xmlChar_ptr;n_systemId++) {
    for (n_notationName = 0;n_notationName < gen_nb_const_xmlChar_ptr;n_notationName++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        publicId = gen_const_xmlChar_ptr(n_publicId, 2);
        systemId = gen_const_xmlChar_ptr(n_systemId, 3);
        notationName = gen_const_xmlChar_ptr(n_notationName, 4);

        xmlSAX2UnparsedEntityDecl(ctx, (const xmlChar *)name, (const xmlChar *)publicId, (const xmlChar *)systemId, (const xmlChar *)notationName);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        des_const_xmlChar_ptr(n_publicId, (const xmlChar *)publicId, 2);
        des_const_xmlChar_ptr(n_systemId, (const xmlChar *)systemId, 3);
        des_const_xmlChar_ptr(n_notationName, (const xmlChar *)notationName, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2UnparsedEntityDecl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_name);
            printf(" %d", n_publicId);
            printf(" %d", n_systemId);
            printf(" %d", n_notationName);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}